

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstrncmp(bstring b0,bstring b1,int n)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *puVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar5 = -0x8000;
  if ((((b1 != (bstring)0x0 && b0 != (bstring)0x0) && (puVar3 = b0->data, puVar3 != (uchar *)0x0))
      && (puVar4 = b1->data, puVar4 != (uchar *)0x0)) &&
     ((uVar1 = b0->slen, -1 < (int)uVar1 && (uVar2 = b1->slen, -1 < (int)uVar2)))) {
    uVar6 = n;
    if ((int)uVar1 < n) {
      uVar6 = uVar1;
    }
    if ((int)uVar2 <= (int)uVar6) {
      uVar6 = uVar2;
    }
    if (0 < (int)uVar6 && puVar3 != puVar4) {
      uVar7 = 0;
      do {
        iVar5 = (int)(char)puVar3[uVar7] - (int)(char)puVar4[uVar7];
        if (iVar5 != 0) {
          return iVar5;
        }
        if (puVar3[uVar7] == '\0') goto LAB_001164c9;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    if (uVar1 == uVar2 || uVar6 == n) {
LAB_001164c9:
      iVar5 = 0;
    }
    else {
      iVar5 = (uint)((int)uVar6 < (int)uVar1) * 2 + -1;
    }
  }
  return iVar5;
}

Assistant:

int bstrncmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v = ((char) b0->data[i]) - ((char) b1->data[i]);
			if (v != 0) return v;
			if (b0->data[i] == (unsigned char) '\0') return 0;
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) return 1;
	return -1;
}